

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase229::run(TestCase229 *this)

{
  SchemaLoader loader;
  SchemaLoader local_1a0;
  Runnable local_178;
  SchemaLoader *local_170;
  Maybe<kj::Exception> local_168;
  
  SchemaLoader::SchemaLoader(&local_1a0);
  SchemaLoader::loadNative(&local_1a0,(RawSchema *)schemas::s_a851ad32cbc2ffea);
  local_178._vptr_Runnable = (_func_int **)&PTR_run_0062ff28;
  local_170 = &local_1a0;
  kj::_::runCatchingExceptions(&local_168,&local_178);
  if (local_168.ptr.isSet == true) {
    kj::Exception::~Exception(&local_168.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[153]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0xe9,ERROR,
               "\"failed: expected \" \"kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != nullptr\""
               ,(char (*) [153])
                "failed: expected kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != nullptr"
              );
  }
  SchemaLoader::~SchemaLoader(&local_1a0);
  return;
}

Assistant:

TEST(SchemaLoader, Incompatible) {
  SchemaLoader loader;
  loader.loadCompiledTypeAndDependencies<test::TestListDefaults>();
  EXPECT_NONFATAL_FAILURE(
      loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()));
}